

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bdfdrivr.c
# Opt level: O2

FT_Error BDF_Size_Select(FT_Size size,FT_ULong strike_index)

{
  long lVar1;
  
  lVar1 = size->face[1].face_flags;
  FT_Select_Metrics(size->face,strike_index);
  (size->metrics).ascender = *(long *)(lVar1 + 0x40) << 6;
  (size->metrics).descender = *(long *)(lVar1 + 0x48) * -0x40;
  (size->metrics).max_advance = (ulong)*(ushort *)(lVar1 + 8) << 6;
  return 0;
}

Assistant:

FT_CALLBACK_DEF( FT_Error )
  BDF_Size_Select( FT_Size   size,
                   FT_ULong  strike_index )
  {
    bdf_font_t*  bdffont = ( (BDF_Face)size->face )->bdffont;


    FT_Select_Metrics( size->face, strike_index );

    size->metrics.ascender    = bdffont->font_ascent * 64;
    size->metrics.descender   = -bdffont->font_descent * 64;
    size->metrics.max_advance = bdffont->bbx.width * 64;

    return FT_Err_Ok;
  }